

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestSpecParser::addPattern<Catch::TestSpec::NamePattern>(TestSpecParser *this)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  shared_ptr<Catch::TestSpec::ExcludedPattern> local_120;
  undefined1 local_110 [24];
  PatternPtr pattern;
  allocator<char> local_c9;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  ulong local_38;
  size_t i;
  string token;
  TestSpecParser *this_local;
  
  token.field_2._8_8_ = this;
  subString_abi_cxx11_((string *)&i,this);
  for (local_38 = 0; uVar1 = local_38,
      sVar3 = clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        (&this->m_escapeChars), uVar1 < sVar3; local_38 = local_38 + 1) {
    pvVar4 = clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_escapeChars,local_38);
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,0,
               (*pvVar4 - this->m_start) - local_38);
    pvVar4 = clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_escapeChars,local_38);
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
               ((*pvVar4 - this->m_start) - local_38) + 1,0xffffffffffffffff);
    std::operator+(&local_58,&local_78,&local_a8);
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_78);
  }
  clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->m_escapeChars);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"exclude:",&local_c9);
  bVar2 = startsWith((string *)&i,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  if (bVar2) {
    this->m_exclusion = true;
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &pattern.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
               8,0xffffffffffffffff);
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &pattern.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount);
    std::__cxx11::string::~string
              ((string *)
               &pattern.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  bVar2 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
  if (!bVar2) {
    std::make_shared<Catch::TestSpec::NamePattern,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
    std::shared_ptr<Catch::TestSpec::Pattern>::shared_ptr<Catch::TestSpec::NamePattern,void>
              ((shared_ptr<Catch::TestSpec::Pattern> *)(local_110 + 0x10),
               (shared_ptr<Catch::TestSpec::NamePattern> *)local_110);
    clara::std::shared_ptr<Catch::TestSpec::NamePattern>::~shared_ptr
              ((shared_ptr<Catch::TestSpec::NamePattern> *)local_110);
    if ((this->m_exclusion & 1U) != 0) {
      std::make_shared<Catch::TestSpec::ExcludedPattern,std::shared_ptr<Catch::TestSpec::Pattern>&>
                ((shared_ptr<Catch::TestSpec::Pattern> *)&local_120);
      std::shared_ptr<Catch::TestSpec::Pattern>::operator=
                ((shared_ptr<Catch::TestSpec::Pattern> *)(local_110 + 0x10),&local_120);
      clara::std::shared_ptr<Catch::TestSpec::ExcludedPattern>::~shared_ptr(&local_120);
    }
    clara::std::
    vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
    ::push_back(&(this->m_currentFilter).m_patterns,(value_type *)(local_110 + 0x10));
    clara::std::shared_ptr<Catch::TestSpec::Pattern>::~shared_ptr
              ((shared_ptr<Catch::TestSpec::Pattern> *)(local_110 + 0x10));
  }
  this->m_exclusion = false;
  this->m_mode = None;
  std::__cxx11::string::~string((string *)&i);
  return;
}

Assistant:

void addPattern() {
            std::string token = subString();
            for( std::size_t i = 0; i < m_escapeChars.size(); ++i )
                token = token.substr( 0, m_escapeChars[i]-m_start-i ) + token.substr( m_escapeChars[i]-m_start-i+1 );
            m_escapeChars.clear();
            if( startsWith( token, "exclude:" ) ) {
                m_exclusion = true;
                token = token.substr( 8 );
            }
            if( !token.empty() ) {
                TestSpec::PatternPtr pattern = std::make_shared<T>( token );
                if( m_exclusion )
                    pattern = std::make_shared<TestSpec::ExcludedPattern>( pattern );
                m_currentFilter.m_patterns.push_back( pattern );
            }
            m_exclusion = false;
            m_mode = None;
        }